

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::getShaderImageFormatQualifier_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,TextureFormat *format)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  char *typePart;
  char *orderPart;
  TextureFormat *format_local;
  
  if (*(int *)this == 0) {
    typePart = "r";
  }
  else if (*(int *)this == 8) {
    typePart = "rgba";
  }
  else {
    typePart = (char *)0x0;
  }
  switch(*(undefined4 *)(this + 4)) {
  case 0:
    local_28 = "8_snorm";
    break;
  case 1:
    local_28 = "16_snorm";
    break;
  default:
    local_28 = (char *)0x0;
    break;
  case 3:
    local_28 = "8";
    break;
  case 4:
    local_28 = "16";
    break;
  case 0x1b:
    local_28 = "8i";
    break;
  case 0x1c:
    local_28 = "16i";
    break;
  case 0x1d:
    local_28 = "32i";
    break;
  case 0x1e:
    local_28 = "8ui";
    break;
  case 0x1f:
    local_28 = "16ui";
    break;
  case 0x21:
    local_28 = "32ui";
    break;
  case 0x22:
    local_28 = "16f";
    break;
  case 0x23:
    local_28 = "32f";
  }
  orderPart = (char *)this;
  format_local = (TextureFormat *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_68);
  std::operator+(&local_48,&local_68,typePart);
  std::operator+(__return_storage_ptr__,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

static inline string getShaderImageFormatQualifier (const TextureFormat& format)
{
	const char* orderPart;
	const char* typePart;

	switch (format.order)
	{
		case TextureFormat::R:		orderPart = "r";		break;
		case TextureFormat::RGBA:	orderPart = "rgba";		break;
		default:
			DE_ASSERT(false);
			orderPart = DE_NULL;
	}

	switch (format.type)
	{
		case TextureFormat::FLOAT:				typePart = "32f";			break;
		case TextureFormat::HALF_FLOAT:			typePart = "16f";			break;

		case TextureFormat::UNSIGNED_INT32:		typePart = "32ui";			break;
		case TextureFormat::UNSIGNED_INT16:		typePart = "16ui";			break;
		case TextureFormat::UNSIGNED_INT8:		typePart = "8ui";			break;

		case TextureFormat::SIGNED_INT32:		typePart = "32i";			break;
		case TextureFormat::SIGNED_INT16:		typePart = "16i";			break;
		case TextureFormat::SIGNED_INT8:		typePart = "8i";			break;

		case TextureFormat::UNORM_INT16:		typePart = "16";			break;
		case TextureFormat::UNORM_INT8:			typePart = "8";				break;

		case TextureFormat::SNORM_INT16:		typePart = "16_snorm";		break;
		case TextureFormat::SNORM_INT8:			typePart = "8_snorm";		break;

		default:
			DE_ASSERT(false);
			typePart = DE_NULL;
	}

	return string() + orderPart + typePart;
}